

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.c
# Opt level: O0

void hashtest(uint32_t version,uint32_t t,uint32_t m,uint32_t p,char *pwd,char *salt,char *hexref,
             char *mcfref)

{
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  int local_120;
  int i;
  int ret;
  char encoded [108];
  uchar hex_out [68];
  byte local_58 [8];
  uchar out [32];
  char *salt_local;
  char *pwd_local;
  uint32_t p_local;
  uint32_t m_local;
  uint32_t t_local;
  uint32_t version_local;
  
  printf("Hash test: $v=%d t=%d, m=%d, p=%d, pass=%s, salt=%s: ",(ulong)version,(ulong)t,(ulong)m,
         (ulong)p,pwd,salt);
  sVar2 = strlen(pwd);
  sVar3 = strlen(salt);
  iVar1 = argon2_hash(t,1 << ((byte)m & 0x1f),p,pwd,sVar2,salt,sVar3,local_58,0x20,&i,0x6c,1,version
                     );
  if (iVar1 != 0) {
    __assert_fail("ret == ARGON2_OK",
                  "/workspace/llm4binary/github/license_c_cmakelists/WOnder93[P]argon2/tests/test.c"
                  ,0x21,
                  "void hashtest(uint32_t, uint32_t, uint32_t, uint32_t, char *, char *, char *, char *)"
                 );
  }
  for (local_120 = 0; local_120 < 0x20; local_120 = local_120 + 1) {
    sprintf(encoded + (long)(local_120 << 1) + 0x68,"%02x",(ulong)local_58[local_120]);
  }
  iVar1 = memcmp(encoded + 0x68,hexref,0x40);
  if (iVar1 != 0) {
    __assert_fail("memcmp(hex_out, hexref, OUT_LEN * 2) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/WOnder93[P]argon2/tests/test.c"
                  ,0x26,
                  "void hashtest(uint32_t, uint32_t, uint32_t, uint32_t, char *, char *, char *, char *)"
                 );
  }
  if (version == 0x13) {
    sVar2 = strlen(mcfref);
    iVar1 = memcmp(&i,mcfref,sVar2);
    if (iVar1 != 0) {
      __assert_fail("memcmp(encoded, mcfref, strlen(mcfref)) == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/WOnder93[P]argon2/tests/test.c"
                    ,0x29,
                    "void hashtest(uint32_t, uint32_t, uint32_t, uint32_t, char *, char *, char *, char *)"
                   );
    }
  }
  sVar2 = strlen(pwd);
  iVar1 = argon2_verify(&i,pwd,sVar2,1);
  if (iVar1 != 0) {
    __assert_fail("ret == ARGON2_OK",
                  "/workspace/llm4binary/github/license_c_cmakelists/WOnder93[P]argon2/tests/test.c"
                  ,0x2d,
                  "void hashtest(uint32_t, uint32_t, uint32_t, uint32_t, char *, char *, char *, char *)"
                 );
  }
  sVar2 = strlen(pwd);
  iVar1 = argon2_verify(mcfref,pwd,sVar2,1);
  if (iVar1 != 0) {
    __assert_fail("ret == ARGON2_OK",
                  "/workspace/llm4binary/github/license_c_cmakelists/WOnder93[P]argon2/tests/test.c"
                  ,0x2f,
                  "void hashtest(uint32_t, uint32_t, uint32_t, uint32_t, char *, char *, char *, char *)"
                 );
  }
  printf("PASS\n");
  return;
}

Assistant:

void hashtest(uint32_t version, uint32_t t, uint32_t m, uint32_t p, char *pwd,
              char *salt, char *hexref, char *mcfref) {
    unsigned char out[OUT_LEN];
    unsigned char hex_out[OUT_LEN * 2 + 4];
    char encoded[ENCODED_LEN];
    int ret, i;

    printf("Hash test: $v=%d t=%d, m=%d, p=%d, pass=%s, salt=%s: ", version,
           t, m, p, pwd, salt);

    ret = argon2_hash(t, 1 << m, p, pwd, strlen(pwd), salt, strlen(salt), out,
                      OUT_LEN, encoded, ENCODED_LEN, Argon2_i, version);
    assert(ret == ARGON2_OK);

    for (i = 0; i < OUT_LEN; ++i)
        sprintf((char *)(hex_out + i * 2), "%02x", out[i]);

    assert(memcmp(hex_out, hexref, OUT_LEN * 2) == 0);

    if (ARGON2_VERSION_NUMBER == version) {
        assert(memcmp(encoded, mcfref, strlen(mcfref)) == 0);
    }

    ret = argon2_verify(encoded, pwd, strlen(pwd), Argon2_i);
    assert(ret == ARGON2_OK);
    ret = argon2_verify(mcfref, pwd, strlen(pwd), Argon2_i);
    assert(ret == ARGON2_OK);

    printf("PASS\n");
}